

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall
Js::InlineCache::CacheLocal
          (InlineCache *this,Type *type,PropertyId propertyId,PropertyIndex propertyIndex,
          bool isInlineSlot,Type *typeWithoutProperty,int requiredAuxSlotCapacity,
          ScriptContext *requestContext)

{
  code *pcVar1;
  Type *pTVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  PropertyRecord *pPVar6;
  Type *pTVar7;
  
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x16,"(type)","type");
    if (!bVar3) goto LAB_00970267;
    *puVar4 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x17,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00970267;
    *puVar4 = 0;
  }
  if (propertyIndex == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x18,"(propertyIndex != Constants::NoSlot)",
                                "propertyIndex != Constants::NoSlot");
    if (!bVar3) goto LAB_00970267;
    *puVar4 = 0;
  }
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x19,"(requestContext)","requestContext");
    if (!bVar3) goto LAB_00970267;
    *puVar4 = 0;
  }
  pSVar5 = Js::Type::GetScriptContext(type);
  if (pSVar5 != requestContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x1a,"(type->GetScriptContext() == requestContext)",
                                "type->GetScriptContext() == requestContext");
    if (!bVar3) goto LAB_00970267;
    *puVar4 = 0;
  }
  VerifyRegistrationForInvalidation(this,requestContext,propertyId);
  if (0x7fff < (uint)requiredAuxSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x1c,
                                "(requiredAuxSlotCapacity >= 0 && requiredAuxSlotCapacity < 0x01 << RequiredAuxSlotCapacityBitCount)"
                                ,
                                "requiredAuxSlotCapacity >= 0 && requiredAuxSlotCapacity < 0x01 << RequiredAuxSlotCapacityBitCount"
                               );
    if (!bVar3) goto LAB_00970267;
    *puVar4 = 0;
  }
  if ((typeWithoutProperty != (Type *)0x0) &&
     ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) != (undefined1  [24])0x0
     )) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x1f,"(typeWithoutProperty == nullptr || !IsProto())",
                                "typeWithoutProperty == nullptr || !IsProto()");
    if (!bVar3) {
LAB_00970267:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  requestContext->hasUsedInlineCache = true;
  Memory::InlineCacheAllocator::Unlock(&requestContext->inlineCacheAllocator);
  if ((typeWithoutProperty != (Type *)0x0) && (this->invalidationListSlotPtr == (InlineCache **)0x0)
     ) {
    ScriptContext::RegisterStoreFieldInlineCache(requestContext,this,propertyId);
  }
  pTVar7 = (Type *)((ulong)typeWithoutProperty | 4);
  if (typeWithoutProperty == (Type *)0x0) {
    pTVar7 = typeWithoutProperty;
  }
  pTVar2 = (Type *)((ulong)type | 4);
  if (isInlineSlot) {
    pTVar7 = typeWithoutProperty;
    pTVar2 = type;
  }
  (this->u).local.type = pTVar2;
  (this->u).local.typeWithoutProperty = pTVar7;
  (this->u).local.slotIndex = propertyIndex;
  (this->u).local.field_2 =
       (anon_union_2_2_ecfd7102_for_s_local_2)((short)requiredAuxSlotCapacity * 2 + 1);
  type->flags = type->flags | TypeFlagMask_HasBeenCached;
  if (typeWithoutProperty != (Type *)0x0) {
    typeWithoutProperty->flags = typeWithoutProperty->flags | TypeFlagMask_HasBeenCached;
  }
  VerifyRegistrationForInvalidation(this,requestContext,propertyId);
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
  if ((bVar3) && (DAT_015bc46a == '\x01')) {
    pPVar6 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"IC::CacheLocal, %s: ",pPVar6 + 1);
    Dump(this);
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void InlineCache::CacheLocal(
        Type *const type,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        Type *const typeWithoutProperty,
        int requiredAuxSlotCapacity,
        ScriptContext *const requestContext)
    {
        Assert(type);
        Assert(propertyId != Constants::NoProperty);
        Assert(propertyIndex != Constants::NoSlot);
        Assert(requestContext);
        Assert(type->GetScriptContext() == requestContext);
        DebugOnly(VerifyRegistrationForInvalidation(this, requestContext, propertyId));
        Assert(requiredAuxSlotCapacity >= 0 && requiredAuxSlotCapacity < 0x01 << RequiredAuxSlotCapacityBitCount);
        // Store field and load field caches are never shared so we should never have a prototype cache morphing into an add property cache.
        // We may, however, have a flags cache (setter) change to add property cache.
        Assert(typeWithoutProperty == nullptr || !IsProto());

        requestContext->SetHasUsedInlineCache(true);

        // Add cache into a store field cache list if required, but not there yet.
        if (typeWithoutProperty != nullptr && invalidationListSlotPtr == nullptr)
        {
            // Note, this can throw due to OOM, so we need to do it before the inline cache is set below.
            requestContext->RegisterStoreFieldInlineCache(this, propertyId);
        }

        if (isInlineSlot)
        {
            u.local.type = type;
            u.local.typeWithoutProperty = typeWithoutProperty;
        }
        else
        {
            u.local.type = TypeWithAuxSlotTag(type);
            u.local.typeWithoutProperty = typeWithoutProperty ? TypeWithAuxSlotTag(typeWithoutProperty) : nullptr;
        }

        u.local.isLocal = true;
        u.local.slotIndex = propertyIndex;
        u.local.requiredAuxSlotCapacity = requiredAuxSlotCapacity;

        type->SetHasBeenCached();
        if (typeWithoutProperty)
        {
            typeWithoutProperty->SetHasBeenCached();
        }

        DebugOnly(VerifyRegistrationForInvalidation(this, requestContext, propertyId));

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            Output::Print(_u("IC::CacheLocal, %s: "), requestContext->GetPropertyName(propertyId)->GetBuffer());
            Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }